

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsOct<unsigned_short>
          (IntDigits *this,unsigned_short v)

{
  long lVar1;
  long lVar2;
  ushort uVar3;
  ulong uVar4;
  
  lVar1 = 0;
  uVar4 = (ulong)v;
  do {
    lVar2 = lVar1;
    this->storage_[lVar2 + 0x2b] = (byte)uVar4 & 7 | 0x30;
    uVar3 = (ushort)uVar4;
    lVar1 = lVar2 + -1;
    uVar4 = uVar4 >> 3;
  } while (7 < uVar3);
  this->start_ = this->storage_ + lVar2 + 0x2b;
  this->size_ = -(lVar2 + -1);
  return;
}

Assistant:

void PrintAsOct(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);
    do {
      *--p = static_cast<char>('0' + (static_cast<size_t>(v) & 7));
      v >>= 3;
    } while (v);
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }